

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFListTable.cpp
# Opt level: O2

Error __thiscall
llvm::DWARFListTableHeader::extract
          (DWARFListTableHeader *this,DWARFDataExtractor Data,uint64_t *OffsetPtr)

{
  ulong uVar1;
  DWARFListTableHeader *pDVar2;
  byte bVar3;
  uint8_t uVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint64_t uVar8;
  char *pcVar9;
  char *pcVar10;
  uint64_t *in_RDX;
  uint32_t Size;
  uint64_t *Vals_1;
  uint64_t *Vals_2;
  uint32_t I;
  uint uVar11;
  ulong uVar12;
  error_code EC;
  error_code EC_00;
  error_code EC_01;
  error_code EC_02;
  error_code EC_03;
  uint64_t local_50;
  uint64_t FullLength;
  ulong *local_40;
  DWARFListTableHeader *local_38;
  
  uVar12 = *in_RDX;
  OffsetPtr[6] = uVar12;
  if ((0xfffffffffffffffb < uVar12) || (Data.super_DataExtractor.Data.Length <= uVar12 + 3)) {
    pcVar9 = (char *)std::_V2::generic_category();
    local_50 = OffsetPtr[7];
    EC._M_cat = (error_category *)0x16;
    EC._0_8_ = this;
    createStringError<char_const*,unsigned_long>
              (EC,pcVar9,
               (char **)"section is not large enough to contain a %s table length at offset 0x%lx",
               &local_50);
    return (Error)(ErrorInfoBase *)this;
  }
  Vals_2 = OffsetPtr + 6;
  *(undefined1 *)(OffsetPtr + 5) = 0;
  local_38 = this;
  uVar8 = DWARFDataExtractor::getRelocatedValue(&Data,4,in_RDX,(uint64_t *)0x0,(Error *)0x0);
  *OffsetPtr = uVar8;
  if (uVar8 == 0xffffffff) {
    *(undefined1 *)(OffsetPtr + 5) = 1;
    uVar8 = DataExtractor::getU64(&Data.super_DataExtractor,in_RDX,(Error *)0x0);
    *OffsetPtr = uVar8;
    Size = 8;
  }
  else {
    Size = 4;
    if (0xffffffe < uVar8 >> 4) {
      pcVar9 = (char *)std::_V2::generic_category();
      local_50 = OffsetPtr[7];
      Vals_1 = &local_50;
      pcVar10 = "%s table at offset 0x%lx has unsupported reserved unit length of value 0x%8.8lx";
      goto LAB_00d9daff;
    }
  }
  local_40 = Vals_2;
  bVar3 = dwarf::getUnitLengthFieldByteSize(*(DwarfFormat *)(OffsetPtr + 5));
  uVar12 = bVar3 + uVar8;
  local_50 = uVar12;
  uVar8 = length((DWARFListTableHeader *)OffsetPtr);
  if (uVar12 != uVar8) {
    __assert_fail("FullLength == length()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFListTable.cpp"
                  ,0x2a,"Error llvm::DWARFListTableHeader::extract(DWARFDataExtractor, uint64_t *)")
    ;
  }
  bVar3 = getHeaderSize(*(DwarfFormat *)(OffsetPtr + 5));
  if (uVar12 < bVar3) {
    pcVar9 = (char *)std::_V2::generic_category();
    FullLength = OffsetPtr[7];
    Vals_1 = &FullLength;
    pcVar10 = "%s table at offset 0x%lx has too small length (0x%lx) to contain a complete header";
    Vals_2 = local_40;
  }
  else {
    uVar1 = *local_40;
    if ((uVar1 <= uVar12 + uVar1) && ((uVar1 + uVar12) - 1 < Data.super_DataExtractor.Data.Length))
    {
      uVar5 = DataExtractor::getU16(&Data.super_DataExtractor,in_RDX,(Error *)0x0);
      *(uint16_t *)(OffsetPtr + 1) = uVar5;
      uVar4 = DataExtractor::getU8(&Data.super_DataExtractor,in_RDX,(Error *)0x0);
      *(uint8_t *)((long)OffsetPtr + 10) = uVar4;
      uVar4 = DataExtractor::getU8(&Data.super_DataExtractor,in_RDX,(Error *)0x0);
      *(uint8_t *)((long)OffsetPtr + 0xb) = uVar4;
      uVar6 = DataExtractor::getU32(&Data.super_DataExtractor,in_RDX,(Error *)0x0);
      *(uint32_t *)((long)OffsetPtr + 0xc) = uVar6;
      if ((short)OffsetPtr[1] != 5) {
        pcVar9 = (char *)std::_V2::generic_category();
        pDVar2 = local_38;
        FullLength = OffsetPtr[7];
        EC_01._M_cat = (error_category *)0x16;
        EC_01._0_8_ = local_38;
        createStringError<char_const*,unsigned_short,unsigned_long>
                  (EC_01,pcVar9,(char **)"unrecognised %s table version %u in table at offset 0x%lx"
                   ,(unsigned_short *)&FullLength,OffsetPtr + 1);
        return (Error)(ErrorInfoBase *)pDVar2;
      }
      if ((*(char *)((long)OffsetPtr + 10) == '\x04') || (*(char *)((long)OffsetPtr + 10) == '\b'))
      {
        if (*(char *)((long)OffsetPtr + 0xb) == '\0') {
          uVar8 = OffsetPtr[6];
          bVar3 = getHeaderSize(*(DwarfFormat *)(OffsetPtr + 5));
          uVar7 = *(uint *)((long)OffsetPtr + 0xc);
          if (uVar12 + uVar1 < (ulong)(uVar7 * Size) + bVar3 + uVar8) {
            pcVar9 = (char *)std::_V2::generic_category();
            pDVar2 = local_38;
            FullLength = OffsetPtr[7];
            EC_03._M_cat = (error_category *)0x16;
            EC_03._0_8_ = local_38;
            createStringError<char_const*,unsigned_long,unsigned_int>
                      (EC_03,pcVar9,
                       (char **)
                       "%s table at offset 0x%lx has more offset entries (%u) than there is space for"
                       ,&FullLength,(uint *)local_40);
            return (Error)(ErrorInfoBase *)pDVar2;
          }
          Data.super_DataExtractor.AddressSize = *(uint8_t *)((long)OffsetPtr + 10);
          for (uVar11 = 0; uVar11 < uVar7; uVar11 = uVar11 + 1) {
            FullLength = DWARFDataExtractor::getRelocatedValue
                                   (&Data,Size,in_RDX,(uint64_t *)0x0,(Error *)0x0);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(OffsetPtr + 2),
                       &FullLength);
            uVar7 = *(uint *)((long)OffsetPtr + 0xc);
          }
          (local_38->HeaderData).Length = 1;
          return (Error)(ErrorInfoBase *)local_38;
        }
        pcVar9 = (char *)std::_V2::generic_category();
        FullLength = OffsetPtr[7];
        pcVar10 = "%s table at offset 0x%lx has unsupported segment selector size %u";
      }
      else {
        pcVar9 = (char *)std::_V2::generic_category();
        FullLength = OffsetPtr[7];
        pcVar10 = "%s table at offset 0x%lx has unsupported address size %u";
      }
      pDVar2 = local_38;
      EC_02._M_cat = (error_category *)0x5f;
      EC_02._0_8_ = local_38;
      createStringError<char_const*,unsigned_long,unsigned_char>
                (EC_02,pcVar9,(char **)pcVar10,&FullLength,(uchar *)local_40);
      return (Error)(ErrorInfoBase *)pDVar2;
    }
    pcVar9 = (char *)std::_V2::generic_category();
    FullLength = OffsetPtr[7];
    Vals_1 = &FullLength;
    pcVar10 = "section is not large enough to contain a %s table of length 0x%lx at offset 0x%lx";
    Vals_2 = &local_50;
  }
LAB_00d9daff:
  pDVar2 = local_38;
  EC_00._M_cat = (error_category *)0x16;
  EC_00._0_8_ = local_38;
  createStringError<char_const*,unsigned_long,unsigned_long>
            (EC_00,pcVar9,(char **)pcVar10,Vals_1,Vals_2);
  return (Error)(ErrorInfoBase *)pDVar2;
}

Assistant:

Error DWARFListTableHeader::extract(DWARFDataExtractor Data,
                                    uint64_t *OffsetPtr) {
  HeaderOffset = *OffsetPtr;
  // Read and verify the length field.
  if (!Data.isValidOffsetForDataOfSize(*OffsetPtr, sizeof(uint32_t)))
    return createStringError(errc::invalid_argument,
                       "section is not large enough to contain a "
                       "%s table length at offset 0x%" PRIx64,
                       SectionName.data(), *OffsetPtr);
  Format = dwarf::DwarfFormat::DWARF32;
  uint8_t OffsetByteSize = 4;
  HeaderData.Length = Data.getRelocatedValue(4, OffsetPtr);
  if (HeaderData.Length == dwarf::DW_LENGTH_DWARF64) {
    Format = dwarf::DwarfFormat::DWARF64;
    OffsetByteSize = 8;
    HeaderData.Length = Data.getU64(OffsetPtr);
  } else if (HeaderData.Length >= dwarf::DW_LENGTH_lo_reserved) {
    return createStringError(errc::invalid_argument,
        "%s table at offset 0x%" PRIx64
        " has unsupported reserved unit length of value 0x%8.8" PRIx64,
        SectionName.data(), HeaderOffset, HeaderData.Length);
  }
  uint64_t FullLength =
      HeaderData.Length + dwarf::getUnitLengthFieldByteSize(Format);
  assert(FullLength == length());
  if (FullLength < getHeaderSize(Format))
    return createStringError(errc::invalid_argument,
                       "%s table at offset 0x%" PRIx64
                       " has too small length (0x%" PRIx64
                       ") to contain a complete header",
                       SectionName.data(), HeaderOffset, FullLength);
  uint64_t End = HeaderOffset + FullLength;
  if (!Data.isValidOffsetForDataOfSize(HeaderOffset, FullLength))
    return createStringError(errc::invalid_argument,
                       "section is not large enough to contain a %s table "
                       "of length 0x%" PRIx64 " at offset 0x%" PRIx64,
                       SectionName.data(), FullLength, HeaderOffset);

  HeaderData.Version = Data.getU16(OffsetPtr);
  HeaderData.AddrSize = Data.getU8(OffsetPtr);
  HeaderData.SegSize = Data.getU8(OffsetPtr);
  HeaderData.OffsetEntryCount = Data.getU32(OffsetPtr);

  // Perform basic validation of the remaining header fields.
  if (HeaderData.Version != 5)
    return createStringError(errc::invalid_argument,
                       "unrecognised %s table version %" PRIu16
                       " in table at offset 0x%" PRIx64,
                       SectionName.data(), HeaderData.Version, HeaderOffset);
  if (HeaderData.AddrSize != 4 && HeaderData.AddrSize != 8)
    return createStringError(errc::not_supported,
                       "%s table at offset 0x%" PRIx64
                       " has unsupported address size %" PRIu8,
                       SectionName.data(), HeaderOffset, HeaderData.AddrSize);
  if (HeaderData.SegSize != 0)
    return createStringError(errc::not_supported,
                       "%s table at offset 0x%" PRIx64
                       " has unsupported segment selector size %" PRIu8,
                       SectionName.data(), HeaderOffset, HeaderData.SegSize);
  if (End < HeaderOffset + getHeaderSize(Format) +
                HeaderData.OffsetEntryCount * OffsetByteSize)
    return createStringError(errc::invalid_argument,
        "%s table at offset 0x%" PRIx64 " has more offset entries (%" PRIu32
        ") than there is space for",
        SectionName.data(), HeaderOffset, HeaderData.OffsetEntryCount);
  Data.setAddressSize(HeaderData.AddrSize);
  for (uint32_t I = 0; I < HeaderData.OffsetEntryCount; ++I)
    Offsets.push_back(Data.getRelocatedValue(OffsetByteSize, OffsetPtr));
  return Error::success();
}